

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::increment(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
            *this)

{
  iterator_range<std::_List_iterator<char>_> *piVar1;
  outer_range_iterator oVar2;
  
  piVar1 = (this->m_begin)._M_current;
  oVar2 = semiintersection_end(this);
  std::
  for_each<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>>*,std::vector<boost::iterator_range<std::_List_iterator<char>>,std::allocator<boost::iterator_range<std::_List_iterator<char>>>>>,std::greater<void>>::increment()::_lambda(auto:1&)_1_>
            (piVar1,oVar2._M_current);
  settle(this);
  return;
}

Assistant:

void increment ()
        {
            std::for_each(m_begin, semiintersection_end(),
                [] (auto & range)
                {
                    range.advance_begin(1);
                });

            settle();
        }